

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O3

PType * __thiscall
FTypeTable::FindType
          (FTypeTable *this,PClass *metatype,intptr_t parm1,intptr_t parm2,size_t *bucketnum)

{
  int iVar1;
  size_t sVar2;
  undefined4 extraout_var;
  PType *pPVar4;
  PClass *pPVar3;
  
  sVar2 = Hash(metatype,parm1,parm2);
  if (bucketnum != (size_t *)0x0) {
    *bucketnum = sVar2 % 0x3fd;
  }
  pPVar4 = this->TypeHash[sVar2 % 0x3fd];
  while( true ) {
    if (pPVar4 == (PType *)0x0) {
      return (PType *)0x0;
    }
    pPVar3 = (pPVar4->super_PTypeBase).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar1 = (**(pPVar4->super_PTypeBase).super_DObject._vptr_DObject)(pPVar4);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar1);
      (pPVar4->super_PTypeBase).super_DObject.Class = pPVar3;
    }
    if ((*(PClass **)
          &pPVar3[1].super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
           super_PType.super_PTypeBase.super_DObject == metatype) &&
       (iVar1 = (*(pPVar4->super_PTypeBase).super_DObject._vptr_DObject[0x13])(pPVar4,parm1,parm2),
       (char)iVar1 != '\0')) break;
    pPVar4 = pPVar4->HashNext;
  }
  return pPVar4;
}

Assistant:

PType *FTypeTable::FindType(PClass *metatype, intptr_t parm1, intptr_t parm2, size_t *bucketnum)
{
	size_t bucket = Hash(metatype, parm1, parm2) % HASH_SIZE;
	if (bucketnum != NULL)
	{
		*bucketnum = bucket;
	}
	for (PType *type = TypeHash[bucket]; type != NULL; type = type->HashNext)
	{
		if (type->GetClass()->TypeTableType == metatype && type->IsMatch(parm1, parm2))
		{
			return type;
		}
	}
	return NULL;
}